

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

char * __thiscall pybind11::cpp_function::strdup_guard::operator()(strdup_guard *this,char *s)

{
  char *t;
  char *local_18;
  
  local_18 = strdup(s);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->strings,&local_18);
  return local_18;
}

Assistant:

char *operator()(const char *s) {
            auto *t = PYBIND11_COMPAT_STRDUP(s);
            strings.push_back(t);
            return t;
        }